

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QLoggingRule>::emplace<QLoggingRule>
          (QMovableArrayOps<QLoggingRule> *this,qsizetype i,QLoggingRule *args)

{
  QLoggingRule **ppQVar1;
  qsizetype *pqVar2;
  QLoggingRule *pQVar3;
  bool bVar4;
  undefined4 uVar5;
  long lVar6;
  Data *pDVar7;
  QLoggingRule *pQVar8;
  Data *pDVar9;
  char16_t *pcVar10;
  qsizetype qVar11;
  undefined4 uVar12;
  PatternFlags PVar13;
  long in_FS_OFFSET;
  bool bVar14;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar7 = (this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.d;
  if ((pDVar7 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0024bb27:
    pDVar9 = (args->category).d.d;
    pcVar10 = (args->category).d.ptr;
    (args->category).d.d = (Data *)0x0;
    (args->category).d.ptr = (char16_t *)0x0;
    qVar11 = (args->category).d.size;
    (args->category).d.size = 0;
    bVar4 = args->enabled;
    uVar5 = args->messageType;
    uVar12 = args->flags;
    bVar14 = (this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.size
             != 0;
    QArrayDataPointer<QLoggingRule>::detachAndGrow
              ((QArrayDataPointer<QLoggingRule> *)this,(uint)(i == 0 && bVar14),1,
               (QLoggingRule **)0x0,(QArrayDataPointer<QLoggingRule> *)0x0);
    pQVar8 = (this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.ptr;
    if (i != 0 || !bVar14) {
      pQVar3 = pQVar8 + i;
      memmove(pQVar3 + 1,pQVar8 + i,
              ((this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.
               size - i) * 0x28);
      (pQVar3->category).d.d = pDVar9;
      (pQVar3->category).d.ptr = pcVar10;
      (pQVar3->category).d.size = qVar11;
      pQVar3->messageType = uVar5;
      pQVar3->flags = (PatternFlags)uVar12;
      pQVar3->enabled = bVar4;
      goto LAB_0024bbea;
    }
    pQVar8[-1].category.d.d = pDVar9;
    pQVar8[-1].category.d.ptr = pcVar10;
    pQVar8[-1].category.d.size = qVar11;
    pQVar8[-1].messageType = uVar5;
    pQVar8[-1].flags = (PatternFlags)uVar12;
    pQVar8[-1].enabled = bVar4;
  }
  else {
    if (((this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.size ==
         i) && (pQVar8 = (this->super_QGenericArrayOps<QLoggingRule>).
                         super_QArrayDataPointer<QLoggingRule>.ptr,
               (pDVar7->super_QArrayData).alloc - i !=
               ((long)((long)pQVar8 -
                      ((ulong)((long)&pDVar7[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3) * -0x3333333333333333)) {
      pDVar9 = (args->category).d.d;
      (args->category).d.d = (Data *)0x0;
      pQVar8[i].category.d.d = pDVar9;
      pcVar10 = (args->category).d.ptr;
      (args->category).d.ptr = (char16_t *)0x0;
      pQVar8[i].category.d.ptr = pcVar10;
      qVar11 = (args->category).d.size;
      (args->category).d.size = 0;
      pQVar8[i].category.d.size = qVar11;
      PVar13.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
      super_QFlagsStorage<QLoggingRule::PatternFlag>.i =
           (args->flags).super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>;
      pQVar8[i].messageType = args->messageType;
      pQVar8[i].flags =
           (PatternFlags)
           PVar13.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
           super_QFlagsStorage<QLoggingRule::PatternFlag>.i;
      pQVar8[i].enabled = args->enabled;
      goto LAB_0024bbea;
    }
    if ((i != 0) ||
       (pQVar8 = (this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.
                 ptr,
       (QLoggingRule *)((ulong)((long)&pDVar7[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
       == pQVar8)) goto LAB_0024bb27;
    pDVar9 = (args->category).d.d;
    (args->category).d.d = (Data *)0x0;
    pQVar8[-1].category.d.d = pDVar9;
    pcVar10 = (args->category).d.ptr;
    (args->category).d.ptr = (char16_t *)0x0;
    pQVar8[-1].category.d.ptr = pcVar10;
    qVar11 = (args->category).d.size;
    (args->category).d.size = 0;
    pQVar8[-1].category.d.size = qVar11;
    PVar13.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
    super_QFlagsStorage<QLoggingRule::PatternFlag>.i =
         (args->flags).super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>;
    pQVar8[-1].messageType = args->messageType;
    pQVar8[-1].flags =
         (PatternFlags)
         PVar13.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
         super_QFlagsStorage<QLoggingRule::PatternFlag>.i;
    pQVar8[-1].enabled = args->enabled;
  }
  ppQVar1 = &(this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_0024bbea:
  pqVar2 = &(this->super_QGenericArrayOps<QLoggingRule>).super_QArrayDataPointer<QLoggingRule>.size;
  *pqVar2 = *pqVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar6) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }